

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractfileiconengine.cpp
# Opt level: O3

QPixmap * __thiscall
QAbstractFileIconEngine::scaledPixmap
          (QPixmap *__return_storage_ptr__,QAbstractFileIconEngine *this,QSize *size,Mode mode,
          State state,qreal scale)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  QExplicitlySharedDataPointer<QPlatformPixmap> QVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  undefined7 extraout_var;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  long in_FS_OFFSET;
  double dVar10;
  double dVar11;
  ulong local_a0;
  undefined1 local_98 [8];
  QPlatformPixmap *pQStack_90;
  QExplicitlySharedDataPointer<QPlatformPixmap> local_88;
  QStringBuilder<char16_t,_QString> local_78;
  QString local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (((size->wd).m_i < 0) || ((size->ht).m_i < 0)) {
    if (*(long *)(in_FS_OFFSET + 0x28) != local_38) goto LAB_00266db5;
    QPixmap::QPixmap(__return_storage_ptr__);
  }
  else {
    local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_58.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    iVar5 = (*(this->super_QPixmapIconEngine).super_QIconEngine._vptr_QIconEngine[0x11])(&local_58);
    if ((undefined1 *)local_58.d.size == (undefined1 *)0x0) {
      dVar10 = scale * (double)(*size).wd.m_i;
      dVar11 = scale * (double)(*size).ht.m_i;
      dVar10 = (double)((ulong)dVar10 & 0x8000000000000000 | 0x3fe0000000000000) + dVar10;
      dVar11 = (double)((ulong)dVar11 & 0x8000000000000000 | 0x3fe0000000000000) + dVar11;
      auVar2._4_4_ = -(uint)(-2147483648.0 < dVar10);
      auVar2._0_4_ = -(uint)(-2147483648.0 < dVar11);
      auVar2._8_4_ = -(uint)(2147483647.0 < dVar11);
      auVar2._12_4_ = -(uint)(2147483647.0 < dVar10);
      uVar6 = movmskps(iVar5,auVar2);
      uVar9 = 0x80000000;
      if ((uVar6 & 2) != 0) {
        uVar9 = (ulong)(uint)(int)dVar10;
      }
      uVar7 = 0x8000000000000000;
      if ((uVar6 & 1) != 0) {
        uVar7 = (ulong)(uint)(int)dVar11 << 0x20;
      }
      uVar8 = 0x7fffffff00000000;
      if ((uVar6 & 4) == 0) {
        uVar8 = uVar7;
      }
      uVar7 = 0x7fffffff;
      if ((uVar6 & 8) == 0) {
        uVar7 = uVar9;
      }
      local_78._0_8_ = uVar7 | uVar8;
      (*(this->super_QPixmapIconEngine).super_QIconEngine._vptr_QIconEngine[0x10])
                (__return_storage_ptr__,this,&local_78,(ulong)mode,state);
    }
    else {
      QString::number((double)(size->wd).m_i * scale,(char)local_98,0x67);
      local_78.b.d.size = (qsizetype)local_88.d.ptr;
      local_78.b.d.ptr = (char16_t *)pQStack_90;
      local_78.b.d.d = (Data *)local_98;
      local_78.a = 0x5f;
      local_98 = (undefined1  [8])0x0;
      pQStack_90 = (QPlatformPixmap *)0x0;
      local_88.d.ptr = (totally_ordered_wrapper<QPlatformPixmap_*>)(QPlatformPixmap *)0x0;
      ::operator+=(&local_58,&local_78);
      if (&(local_78.b.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_78.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_78.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_78.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_78.b.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (local_98 != (undefined1  [8])0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_98)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_98)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_98)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_98,2,0x10);
        }
      }
      (__return_storage_ptr__->data).d.ptr = (QPlatformPixmap *)&DAT_aaaaaaaaaaaaaaaa;
      (__return_storage_ptr__->super_QPaintDevice)._vptr_QPaintDevice =
           (_func_int **)&DAT_aaaaaaaaaaaaaaaa;
      *(undefined1 **)&(__return_storage_ptr__->super_QPaintDevice).painters = &DAT_aaaaaaaaaaaaaaaa
      ;
      QPixmap::QPixmap(__return_storage_ptr__);
      bVar4 = QPixmapCache::find(&local_58,__return_storage_ptr__);
      if (!bVar4) {
        dVar10 = scale * (double)(*size).wd.m_i;
        dVar11 = scale * (double)(*size).ht.m_i;
        dVar10 = (double)((ulong)dVar10 & 0x8000000000000000 | 0x3fe0000000000000) + dVar10;
        dVar11 = (double)((ulong)dVar11 & 0x8000000000000000 | 0x3fe0000000000000) + dVar11;
        auVar1._4_4_ = -(uint)(-2147483648.0 < dVar10);
        auVar1._0_4_ = -(uint)(-2147483648.0 < dVar11);
        auVar1._8_4_ = -(uint)(2147483647.0 < dVar11);
        auVar1._12_4_ = -(uint)(2147483647.0 < dVar10);
        uVar6 = movmskps((int)CONCAT71(extraout_var,bVar4),auVar1);
        uVar9 = 0x80000000;
        if ((uVar6 & 2) != 0) {
          uVar9 = (ulong)(uint)(int)dVar10;
        }
        uVar7 = 0x8000000000000000;
        if ((uVar6 & 1) != 0) {
          uVar7 = (ulong)(uint)(int)dVar11 << 0x20;
        }
        uVar8 = 0x7fffffff00000000;
        if ((uVar6 & 4) == 0) {
          uVar8 = uVar7;
        }
        local_a0 = 0x7fffffff;
        if ((uVar6 & 8) == 0) {
          local_a0 = uVar9;
        }
        local_a0 = local_a0 | uVar8;
        (*(this->super_QPixmapIconEngine).super_QIconEngine._vptr_QIconEngine[0x10])
                  ((QPixmap *)local_98,this,&local_a0,(ulong)mode,state);
        local_78.b.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
        local_78._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_78.b.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        QPaintDevice::QPaintDevice((QPaintDevice *)&local_78);
        QVar3.d.ptr = local_88.d.ptr;
        local_78._0_8_ = &PTR__QPixmap_007d25a8;
        local_88.d.ptr = (totally_ordered_wrapper<QPlatformPixmap_*>)(QPlatformPixmap *)0x0;
        local_78.b.d.ptr = (char16_t *)(__return_storage_ptr__->data).d.ptr;
        (__return_storage_ptr__->data).d.ptr = (QPlatformPixmap *)QVar3.d.ptr;
        QPixmap::~QPixmap((QPixmap *)&local_78);
        QPixmap::~QPixmap((QPixmap *)local_98);
        bVar4 = QPixmap::isNull(__return_storage_ptr__);
        if (!bVar4) {
          QPixmapCache::insert(&local_58,__return_storage_ptr__);
        }
      }
    }
    if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
LAB_00266db5:
      __stack_chk_fail();
    }
  }
  return __return_storage_ptr__;
}

Assistant:

QPixmap QAbstractFileIconEngine::scaledPixmap(const QSize &size, QIcon::Mode mode, QIcon::State state, qreal scale)
{
    Q_UNUSED(mode);
    Q_UNUSED(state);

    if (!size.isValid())
        return QPixmap();

    QString key = cacheKey();
    if (key.isEmpty())
        return filePixmap(size * scale, mode, state);

    key += u'_' + QString::number(size.width() * scale);

    QPixmap result;
    if (!QPixmapCache::find(key, &result)) {
        result = filePixmap(size * scale, mode, state);
        if (!result.isNull())
            QPixmapCache::insert(key, result);
    }

    return result;
}